

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'"'>,_toml::detail::character<'\\'>,_toml::detail::character<'\x7f'>_>_>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  undefined8 f;
  location *plVar1;
  bool bVar2;
  type l;
  region local_148;
  success<toml::detail::region> local_100;
  const_iterator local_b8;
  char *local_b0;
  undefined4 local_a8;
  failure_type local_91;
  const_iterator local_90;
  undefined1 local_88 [8];
  result<toml::detail::region,_toml::detail::none_t> rslt;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_20;
  location *local_18;
  location *loc_local;
  
  local_18 = loc;
  loc_local = (location *)__return_storage_ptr__;
  local_20._M_current = (char *)location::iter(loc);
  local_28._M_current = (char *)location::end(local_18);
  bVar2 = __gnu_cxx::operator==(&local_20,&local_28);
  if (bVar2) {
    none();
    result<toml::detail::region,_toml::detail::none_t>::result
              (__return_storage_ptr__,(failure_type *)((long)&first._M_current + 7));
  }
  else {
    rslt.field_1.succ.value.last_._M_current = location::iter(local_18);
    either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'"'>,_toml::detail::character<'\\'>,_toml::detail::character<'\x7f'>_>
    ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_88,local_18);
    bVar2 = result<toml::detail::region,_toml::detail::none_t>::is_ok
                      ((result<toml::detail::region,_toml::detail::none_t> *)local_88);
    plVar1 = local_18;
    if (bVar2) {
      local_90._M_current = (char *)rslt.field_1.succ.value.last_._M_current;
      location::reset(local_18,rslt.field_1.succ.value.last_._M_current);
      none();
      result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_91);
    }
    else {
      local_b8._M_current = (char *)rslt.field_1.succ.value.last_._M_current;
      local_b0 = (char *)std::
                         next<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                                   (rslt.field_1.succ.value.last_._M_current,1);
      location::reset(plVar1,(const_iterator)local_b0);
      plVar1 = local_18;
      f = rslt.field_1.succ.value.last_._M_current;
      l = location::iter(local_18);
      region::region(&local_148,plVar1,(const_iterator)f,(const_iterator)l._M_current);
      ok<toml::detail::region>(&local_100,&local_148);
      result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_100);
      success<toml::detail::region>::~success(&local_100);
      region::~region(&local_148);
    }
    local_a8 = 1;
    result<toml::detail::region,_toml::detail::none_t>::~result
              ((result<toml::detail::region,_toml::detail::none_t> *)local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        if(loc.iter() == loc.end()) {return none();}
        auto first = loc.iter();

        auto rslt = Combinator::invoke(loc);
        if(rslt.is_ok())
        {
            loc.reset(first);
            return none();
        }
        loc.reset(std::next(first)); // XXX maybe loc.advance() is okay but...
        return ok(region(loc, first, loc.iter()));
    }